

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# graphics_robust_access_pass.cpp
# Opt level: O3

Instruction * __thiscall
spvtools::opt::GraphicsRobustAccessPass::MakeUMinInst
          (GraphicsRobustAccessPass *this,TypeManager *tm,Instruction *x,Instruction *y,
          Instruction *where)

{
  array<signed_char,_4UL> aVar1;
  uint32_t result_id;
  uint32_t uVar2;
  int iVar3;
  uint32_t id;
  int iVar4;
  array<signed_char,_4UL> aVar5;
  Type *pTVar6;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  Instruction *pIVar7;
  pointer *__ptr_1;
  pointer *__ptr;
  default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_> *this_00;
  long lVar8;
  pointer *__ptr_2;
  undefined1 local_1a8 [32];
  __uniq_ptr_impl<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  local_188;
  undefined1 local_180 [32];
  _Head_base<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_false> local_160;
  undefined1 local_158 [32];
  _Head_base<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_false> local_138;
  undefined1 local_130 [32];
  _Head_base<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_false> local_110;
  undefined4 local_108 [2];
  SmallVector<unsigned_int,_2UL> local_100;
  undefined4 local_d8;
  SmallVector<unsigned_int,_2UL> local_d0;
  undefined4 local_a8;
  SmallVector<unsigned_int,_2UL> local_a0;
  undefined4 local_78;
  undefined1 local_70 [32];
  __uniq_ptr_impl<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  local_50;
  undefined8 local_48;
  undefined8 uStack_40;
  undefined8 local_38;
  
  aVar1._M_elems = (_Type)GetGlslInsts(this);
  result_id = Pass::TakeNextId(&this->super_Pass);
  id = 0;
  uVar2 = 0;
  if (x->has_type_id_ == true) {
    uVar2 = Instruction::GetSingleWordOperand(x,0);
  }
  pTVar6 = analysis::TypeManager::GetType(tm,uVar2);
  iVar3 = (*pTVar6->_vptr_Type[9])(pTVar6);
  iVar3 = *(int *)(CONCAT44(extraout_var,iVar3) + 0x24);
  if (y->has_type_id_ == true) {
    id = Instruction::GetSingleWordOperand(y,0);
  }
  pTVar6 = analysis::TypeManager::GetType(tm,id);
  iVar4 = (*pTVar6->_vptr_Type[9])(pTVar6);
  if (iVar3 == *(int *)(CONCAT44(extraout_var_00,iVar4) + 0x24)) {
    aVar5._M_elems[0] = '\0';
    aVar5._M_elems[1] = '\0';
    aVar5._M_elems[2] = '\0';
    aVar5._M_elems[3] = '\0';
    uVar2 = 0;
    if (x->has_type_id_ == true) {
      uVar2 = Instruction::GetSingleWordOperand(x,0);
    }
    local_130._24_8_ = local_130 + 0x10;
    local_130._0_8_ = &PTR__SmallVector_00930a20;
    local_110._M_head_impl = (vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x0;
    local_130._8_8_ = 1;
    local_108[0] = 1;
    local_100._vptr_SmallVector = (_func_int **)&PTR__SmallVector_00930a20;
    local_100.size_ = 0;
    local_100.small_data_ = (uint *)local_100.buffer;
    local_100.large_data_._M_t.
    super___uniq_ptr_impl<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
    ._M_t.
    super__Tuple_impl<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
    .super__Head_base<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_false>.
    _M_head_impl = (__uniq_ptr_data<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>,_true,_true>
                    )(__uniq_ptr_impl<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                      )0x0;
    local_130._16_4_ = aVar1._M_elems;
    utils::SmallVector<unsigned_int,_2UL>::operator=
              (&local_100,(SmallVector<unsigned_int,_2UL> *)local_130);
    local_158._24_8_ = local_158 + 0x10;
    local_158._0_8_ = &PTR__SmallVector_00930a20;
    local_138._M_head_impl = (vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x0;
    local_158[0x10] = '&';
    local_158[0x11] = '\0';
    local_158[0x12] = '\0';
    local_158[0x13] = '\0';
    local_158._8_8_ = 1;
    local_d8 = 7;
    local_d0._vptr_SmallVector = (_func_int **)&PTR__SmallVector_00930a20;
    local_d0.size_ = 0;
    local_d0.small_data_ = (uint *)local_d0.buffer;
    local_d0.large_data_._M_t.
    super___uniq_ptr_impl<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
    ._M_t.
    super__Tuple_impl<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
    .super__Head_base<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_false>.
    _M_head_impl = (__uniq_ptr_data<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>,_true,_true>
                    )(__uniq_ptr_impl<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                      )0x0;
    utils::SmallVector<unsigned_int,_2UL>::operator=
              (&local_d0,(SmallVector<unsigned_int,_2UL> *)local_158);
    if (x->has_result_id_ == true) {
      aVar5._M_elems = (_Type)Instruction::GetSingleWordOperand(x,(uint)x->has_type_id_);
    }
    local_180._24_8_ = local_180 + 0x10;
    local_180._0_8_ = &PTR__SmallVector_00930a20;
    aVar1._M_elems[0] = '\0';
    aVar1._M_elems[1] = '\0';
    aVar1._M_elems[2] = '\0';
    aVar1._M_elems[3] = '\0';
    local_160._M_head_impl = (vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x0;
    local_180._8_8_ = 1;
    local_a8 = 1;
    local_a0._vptr_SmallVector = (_func_int **)&PTR__SmallVector_00930a20;
    local_a0.size_ = 0;
    local_a0.small_data_ = (uint *)local_a0.buffer;
    local_a0.large_data_._M_t.
    super___uniq_ptr_impl<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
    ._M_t.
    super__Tuple_impl<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
    .super__Head_base<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_false>.
    _M_head_impl = (__uniq_ptr_data<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>,_true,_true>
                    )(__uniq_ptr_impl<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                      )0x0;
    local_180._16_4_ = aVar5._M_elems;
    utils::SmallVector<unsigned_int,_2UL>::operator=
              (&local_a0,(SmallVector<unsigned_int,_2UL> *)local_180);
    if (y->has_result_id_ == true) {
      aVar1._M_elems = (_Type)Instruction::GetSingleWordOperand(y,(uint)y->has_type_id_);
    }
    local_1a8._24_8_ = local_1a8 + 0x10;
    local_1a8._0_8_ = &PTR__SmallVector_00930a20;
    local_188._M_t.
    super__Tuple_impl<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
    .super__Head_base<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_false>.
    _M_head_impl = (tuple<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                    )(_Tuple_impl<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                      )0x0;
    local_1a8._8_8_ = 1;
    local_78 = 1;
    local_70._0_8_ = &PTR__SmallVector_00930a20;
    local_70._8_8_ = 0;
    local_70._24_8_ = local_70 + 0x10;
    this_00 = (default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_> *)&local_50
    ;
    local_50._M_t.
    super__Tuple_impl<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
    .super__Head_base<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_false>.
    _M_head_impl = (tuple<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                    )(_Tuple_impl<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                      )0x0;
    local_1a8._16_4_ = aVar1._M_elems;
    utils::SmallVector<unsigned_int,_2UL>::operator=
              ((SmallVector<unsigned_int,_2UL> *)local_70,
               (SmallVector<unsigned_int,_2UL> *)local_1a8);
    local_48 = 0;
    uStack_40 = 0;
    local_38 = 0;
    std::vector<spvtools::opt::Operand,std::allocator<spvtools::opt::Operand>>::
    _M_range_initialize<spvtools::opt::Operand_const*>
              ((vector<spvtools::opt::Operand,std::allocator<spvtools::opt::Operand>> *)&local_48,
               local_108,&local_48);
    pIVar7 = InsertInst(this,where,OpExtInst,uVar2,result_id,(OperandList *)&local_48);
    std::vector<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>::~vector
              ((vector<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_> *)&local_48)
    ;
    lVar8 = -0xc0;
    do {
      *(undefined ***)(this_00 + -0x20) = &PTR__SmallVector_00930a20;
      if (*(vector<unsigned_int,_std::allocator<unsigned_int>_> **)this_00 !=
          (vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x0) {
        std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>::operator()
                  (this_00,*(vector<unsigned_int,_std::allocator<unsigned_int>_> **)this_00);
      }
      *(undefined8 *)this_00 = 0;
      this_00 = this_00 + -0x30;
      lVar8 = lVar8 + 0x30;
    } while (lVar8 != 0);
    local_1a8._0_8_ = &PTR__SmallVector_00930a20;
    if (local_188._M_t.
        super__Tuple_impl<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
        .super__Head_base<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_false>.
        _M_head_impl !=
        (_Tuple_impl<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
         )0x0) {
      std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>::operator()
                ((default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_> *)
                 &local_188,
                 (vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                 local_188._M_t.
                 super__Tuple_impl<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                 .
                 super__Head_base<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_false>
                 ._M_head_impl);
    }
    local_180._0_8_ = &PTR__SmallVector_00930a20;
    if (local_160._M_head_impl != (vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x0) {
      std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>::operator()
                ((default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_> *)
                 &local_160,local_160._M_head_impl);
    }
    local_158._0_8_ = &PTR__SmallVector_00930a20;
    if (local_138._M_head_impl != (vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x0) {
      std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>::operator()
                ((default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_> *)
                 &local_138,local_138._M_head_impl);
    }
    local_130._0_8_ = &PTR__SmallVector_00930a20;
    if (local_110._M_head_impl != (vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x0) {
      std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>::operator()
                ((default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_> *)
                 &local_110,local_110._M_head_impl);
    }
    return pIVar7;
  }
  __assert_fail("xwidth == ywidth",
                "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/graphics_robust_access_pass.cpp"
                ,0x26e,
                "Instruction *spvtools::opt::GraphicsRobustAccessPass::MakeUMinInst(const analysis::TypeManager &, Instruction *, Instruction *, Instruction *)"
               );
}

Assistant:

Instruction* GraphicsRobustAccessPass::MakeUMinInst(
    const analysis::TypeManager& tm, Instruction* x, Instruction* y,
    Instruction* where) {
  // Get IDs of instructions we'll be referencing. Evaluate them before calling
  // the function so we force a deterministic ordering in case both of them need
  // to take a new ID.
  const uint32_t glsl_insts_id = GetGlslInsts();
  uint32_t smin_id = TakeNextId();
  const auto xwidth = tm.GetType(x->type_id())->AsInteger()->width();
  const auto ywidth = tm.GetType(y->type_id())->AsInteger()->width();
  assert(xwidth == ywidth);
  (void)xwidth;
  (void)ywidth;
  auto* smin_inst = InsertInst(
      where, spv::Op::OpExtInst, x->type_id(), smin_id,
      {
          {SPV_OPERAND_TYPE_ID, {glsl_insts_id}},
          {SPV_OPERAND_TYPE_EXTENSION_INSTRUCTION_NUMBER, {GLSLstd450UMin}},
          {SPV_OPERAND_TYPE_ID, {x->result_id()}},
          {SPV_OPERAND_TYPE_ID, {y->result_id()}},
      });
  return smin_inst;
}